

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_67::BinaryReaderIR::OnElseExpr(BinaryReaderIR *this)

{
  ExprList *pEVar1;
  Offset OVar2;
  Result RVar3;
  Expr *pEVar4;
  char *__function;
  Enum EVar5;
  LabelNode *local_38;
  LabelNode *label;
  Expr *expr;
  
  RVar3 = TopLabelExpr(this,&local_38,(Expr **)&label);
  EVar5 = Error;
  if (RVar3.enum_ != Error) {
    if (local_38->label_type == IfExcept) {
      if (*(int *)&label[2].exprs != 0x14) {
        __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExceptExpr, Base = wabt::Expr]"
        ;
        goto LAB_00f31a1d;
      }
      pEVar1 = (ExprList *)this->filename_;
      OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      pEVar4 = (Expr *)strlen((char *)pEVar1);
      label[10].exprs = pEVar1;
      label[10].context = pEVar4;
      *(Offset *)(label + 0xb) = OVar2;
      *(undefined4 *)&label[0xb].exprs = 0;
      local_38->exprs = (ExprList *)&label[0xb].context;
      local_38->label_type = IfExceptElse;
    }
    else {
      if (local_38->label_type != If) {
        PrintError(this,"else expression without matching if");
        return (Result)Error;
      }
      if (*(int *)&label[2].exprs != 0x13) {
        __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_00f31a1d:
        __assert_fail("isa<Derived>(base)",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/cast.h"
                      ,0x4e,__function);
      }
      pEVar1 = (ExprList *)this->filename_;
      OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      pEVar4 = (Expr *)strlen((char *)pEVar1);
      label[10].exprs = pEVar1;
      label[10].context = pEVar4;
      *(Offset *)(label + 0xb) = OVar2;
      *(undefined4 *)&label[0xb].exprs = 0;
      local_38->exprs = (ExprList *)&label[0xb].context;
      local_38->label_type = Else;
    }
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderIR::OnElseExpr() {
  LabelNode* label;
  Expr* expr;
  CHECK_RESULT(TopLabelExpr(&label, &expr));

  if (label->label_type == LabelType::If) {
    auto* if_expr = cast<IfExpr>(expr);
    if_expr->true_.end_loc = GetLocation();
    label->exprs = &if_expr->false_;
    label->label_type = LabelType::Else;
  } else if (label->label_type == LabelType::IfExcept) {
    auto* if_except_expr = cast<IfExceptExpr>(expr);
    if_except_expr->true_.end_loc = GetLocation();
    label->exprs = &if_except_expr->false_;
    label->label_type = LabelType::IfExceptElse;
  } else {
    PrintError("else expression without matching if");
    return Result::Error;
  }

  return Result::Ok;
}